

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_cache_lcp_2way<false,unsigned_int>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uint *cache_input,uint *cache_output,size_t n)

{
  size_t __n;
  size_t __n_00;
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  uint *cache_input0;
  MergeResult MVar5;
  MergeResult MVar6;
  ostream *poVar7;
  uchar **ppuVar8;
  uchar *puVar9;
  uint uVar10;
  lcp_t *plVar11;
  uint *cache_output_00;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  lcp_t lVar15;
  lcp_t *lcp_output_00;
  long lVar16;
  uchar uVar17;
  uchar **ppuVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  char local_89;
  lcp_t *local_88;
  ulong local_80;
  uchar **local_78;
  lcp_t *local_70;
  uint *local_68;
  uchar **local_60;
  uchar **local_58;
  size_t local_50;
  lcp_t *local_48;
  uint *local_40;
  uint *local_38;
  
  local_78 = strings_output;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"mergesort_cache_lcp_2way",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(): n=",6);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_89 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_89,1);
  ppuVar8 = local_78;
  if (0x1f < n) {
    uVar19 = n >> 1;
    MVar5 = mergesort_cache_lcp_2way<true,unsigned_int>
                      (strings_input,local_78,lcp_input,lcp_output,cache_input,cache_output,uVar19);
    local_50 = n - uVar19;
    local_60 = strings_input + uVar19;
    local_58 = ppuVar8 + uVar19;
    local_88 = lcp_input + uVar19;
    lcp_output_00 = lcp_output + uVar19;
    local_38 = cache_input + uVar19;
    cache_output_00 = cache_output + uVar19;
    local_80 = uVar19;
    local_70 = lcp_output;
    local_68 = cache_output;
    if (MVar5 == SortedInPlace) {
      check_input<unsigned_int>(strings_input,lcp_input,cache_input,uVar19);
      cache_input0 = local_38;
      sVar21 = local_50;
      ppuVar8 = local_60;
      plVar11 = local_88;
      local_40 = cache_output_00;
      MVar6 = mergesort_cache_lcp_2way<true,unsigned_int>
                        (local_60,local_58,local_88,lcp_output_00,local_38,cache_output_00,local_50)
      ;
      local_48 = lcp_output_00;
      check_input<unsigned_int>(ppuVar8,plVar11,cache_input0,sVar21);
      if (MVar6 == SortedInPlace) {
        merge_cache_lcp_2way<false,unsigned_int>
                  (strings_input,lcp_input,cache_input,local_80,local_60,local_88,cache_input0,
                   sVar21,local_78,local_70,local_68);
        return SortedInTemp;
      }
      local_88 = (lcp_t *)CONCAT44(local_88._4_4_,MVar6);
    }
    else {
      check_input<unsigned_int>(ppuVar8,lcp_output,cache_output,uVar19);
      sVar21 = local_50;
      ppuVar8 = local_58;
      MVar6 = mergesort_cache_lcp_2way<true,unsigned_int>
                        (local_60,local_58,local_88,lcp_output_00,local_38,cache_output_00,local_50)
      ;
      check_input<unsigned_int>(ppuVar8,lcp_output_00,cache_output_00,sVar21);
      plVar11 = local_70;
      if (MVar5 == MVar6) goto LAB_002490f8;
      local_88 = (lcp_t *)CONCAT44(local_88._4_4_,MVar6);
      local_48 = lcp_output_00;
      local_40 = cache_output_00;
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                        __debug_indent_str_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"Warning: extra copying due to m0 != m1. n=",0x2a);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    __n = local_80 * 8;
    __n_00 = local_80 * 4;
    if (MVar5 == SortedInPlace) {
      memmove(local_78,strings_input,__n);
      memcpy(local_68,cache_input,__n_00);
      plVar11 = local_70;
      memcpy(local_70,lcp_input,__n);
      MVar5 = SortedInTemp;
      MVar6 = (MergeResult)local_88;
    }
    else {
      memmove(strings_input,local_78,__n);
      memcpy(cache_input,local_68,__n_00);
      plVar11 = local_70;
      memcpy(lcp_input,local_70,__n);
      MVar6 = SortedInTemp;
    }
    cache_output_00 = local_40;
    ppuVar8 = local_58;
    lcp_output_00 = local_48;
    sVar21 = local_50;
    if (MVar5 != MVar6) {
      __assert_fail("m0 == m1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x56e,
                    "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
LAB_002490f8:
    merge_cache_lcp_2way<false,unsigned_int>
              (local_78,plVar11,local_68,local_80,ppuVar8,lcp_output_00,cache_output_00,sVar21,
               strings_input,lcp_input,cache_input);
    return SortedInPlace;
  }
  if (1 < n) {
    uVar19 = n & 0xffffffff;
    ppuVar8 = strings_input;
    do {
      pbVar1 = ppuVar8[1];
      ppuVar8 = ppuVar8 + 1;
      for (ppuVar18 = ppuVar8; strings_input < ppuVar18; ppuVar18 = ppuVar18 + -1) {
        pbVar2 = ppuVar18[-1];
        bVar12 = *pbVar2;
        bVar13 = *pbVar1;
        if (bVar12 != 0 && bVar12 == bVar13) {
          lVar16 = 1;
          do {
            bVar12 = pbVar2[lVar16];
            bVar13 = pbVar1[lVar16];
            if (bVar12 == 0) break;
            lVar16 = lVar16 + 1;
          } while (bVar12 == bVar13);
        }
        if (bVar12 <= bVar13) break;
        *ppuVar18 = pbVar2;
      }
      iVar4 = (int)uVar19;
      *ppuVar18 = pbVar1;
      uVar19 = (ulong)(iVar4 - 1);
    } while (2 < iVar4);
  }
  pbVar1 = *strings_input;
  puVar9 = strings_input[1];
  bVar12 = *pbVar1;
  if (bVar12 == 0) {
    *lcp_input = 0;
  }
  else {
    lVar15 = 0;
    bVar13 = bVar12;
    do {
      if (bVar13 != puVar9[lVar15]) break;
      bVar13 = pbVar1[lVar15 + 1];
      lVar15 = lVar15 + 1;
    } while (bVar13 != 0);
    *lcp_input = lVar15;
    if (bVar12 != 0) {
      uVar10 = (uint)bVar12 << 0x18;
      if (pbVar1[1] != 0) {
        uVar10 = uVar10 | (uint)pbVar1[1] << 0x10;
        if (pbVar1[2] != 0) {
          uVar10 = uVar10 | CONCAT11(pbVar1[2],pbVar1[3]);
        }
      }
      goto LAB_00248e17;
    }
  }
  uVar10 = 0;
LAB_00248e17:
  *cache_input = uVar10;
  if (1 < n - 1) {
    uVar19 = 1;
    uVar10 = 1;
    do {
      uVar20 = (ulong)(uVar10 + 1);
      puVar3 = strings_input[uVar20];
      lVar15 = 0;
      uVar17 = *puVar9;
      while ((uVar17 != '\0' && (uVar17 == puVar3[lVar15]))) {
        lVar16 = lVar15 + 1;
        lVar15 = lVar15 + 1;
        uVar17 = puVar9[lVar16];
      }
      lcp_input[uVar19] = lVar15;
      lVar15 = lcp_input[uVar10 - 1];
      if (puVar9[lVar15] == 0) {
        uVar14 = 0;
      }
      else {
        uVar14 = (uint)puVar9[lVar15] << 0x18;
        if (puVar9[lVar15 + 1] != 0) {
          uVar14 = uVar14 | (uint)puVar9[lVar15 + 1] << 0x10;
          if (puVar9[lVar15 + 2] != '\0') {
            uVar14 = uVar14 | CONCAT11(puVar9[lVar15 + 2],puVar9[lVar15 + 3]);
          }
        }
      }
      cache_input[uVar19] = uVar14;
      puVar9 = puVar3;
      uVar19 = uVar20;
      uVar10 = uVar10 + 1;
    } while (uVar20 < n - 1);
  }
  puVar9 = strings_input[n - 1];
  if (puVar9 != (uchar *)0x0) {
    lVar15 = lcp_input[n - 2];
    uVar10 = 0;
    if (puVar9[lVar15] != 0) {
      uVar10 = (uint)puVar9[lVar15] << 0x18;
      if (puVar9[lVar15 + 1] != 0) {
        uVar10 = (uint)puVar9[lVar15 + 1] << 0x10 | uVar10;
        if (puVar9[lVar15 + 2] != '\0') {
          uVar10 = uVar10 | CONCAT11(puVar9[lVar15 + 2],puVar9[lVar15 + 3]);
        }
      }
    }
    cache_input[n - 1] = uVar10;
    check_input<unsigned_int>(strings_input,lcp_input,cache_input,n);
    return SortedInPlace;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x38,"uint32_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}